

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O0

bool __thiscall
cmIncludeGuardCommand::InitialPass
          (cmIncludeGuardCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference __lhs;
  char *pcVar4;
  cmake *this_00;
  cmake *cm;
  cmMakefile *mf;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string includeGuardVar;
  string *arg;
  IncludeGuardScope scope;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmIncludeGuardCommand *this_local;
  
  local_28 = status;
  status_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    arg._0_4_ = 0;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    if (!bVar2) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
      bVar2 = std::operator==(__lhs,"DIRECTORY");
      if (bVar2) {
        arg._0_4_ = 1;
      }
      else {
        bVar2 = std::operator==(__lhs,"GLOBAL");
        if (!bVar2) {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&includeGuardVar.field_2 + 8);
          std::operator+(__return_storage_ptr__,"given an invalid scope: ",__lhs);
          cmCommand::SetError(&this->super_cmCommand,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)(includeGuardVar.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          goto LAB_004213bf;
        }
        arg._0_4_ = 2;
      }
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)((long)&mf + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,pcVar4,(allocator<char> *)((long)&mf + 6));
    anon_unknown.dwarf_70acd3::GetIncludeGuardVariableName((string *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 6));
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
    pcVar1 = (this->super_cmCommand).Makefile;
    if ((int)arg == 0) {
      bVar2 = cmMakefile::IsDefinitionSet(pcVar1,(string *)local_a8);
      if (bVar2) {
        cmExecutionStatus::SetReturnInvoked(local_28);
      }
      else {
        cmMakefile::AddDefinition(pcVar1,(string *)local_a8,true);
      }
    }
    else if ((int)arg == 1) {
      bVar2 = anon_unknown.dwarf_70acd3::CheckIncludeGuardIsSet(pcVar1,(string *)local_a8);
      if (bVar2) {
        cmExecutionStatus::SetReturnInvoked(local_28);
      }
      else {
        cmMakefile::SetProperty(pcVar1,(string *)local_a8,"TRUE");
      }
    }
    else if ((int)arg == 2) {
      this_00 = cmMakefile::GetCMakeInstance(pcVar1);
      pcVar4 = cmake::GetProperty(this_00,(string *)local_a8);
      if (pcVar4 == (char *)0x0) {
        cmake::SetProperty(this_00,(string *)local_a8,"TRUE");
      }
      else {
        cmExecutionStatus::SetReturnInvoked(local_28);
      }
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "given an invalid number of arguments. The command takes at most 1 argument.",
               &local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
LAB_004213bf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIncludeGuardCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  if (args.size() > 1) {
    this->SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      this->SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = this->Makefile;

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinition(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}